

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.h
# Opt level: O2

void __thiscall
Js::StringProfiler::StringMetrics::Accumulate(StringMetrics *this,RequiredEncoding encoding)

{
  if (encoding != ASCII7bit) {
    if (encoding == Unicode16bit) {
      this = (StringMetrics *)&this->countUnicode;
    }
    else {
      if (encoding != ASCII8bit) {
        return;
      }
      this = (StringMetrics *)&this->count8BitASCII;
    }
  }
  this->count7BitASCII = this->count7BitASCII + 1;
  return;
}

Assistant:

void Accumulate( RequiredEncoding encoding )
            {
                switch(encoding)
                {
                case ASCII7bit:
                    this->count7BitASCII++;
                    break;
                case ASCII8bit:
                    this->count8BitASCII++;
                    break;
                case Unicode16bit:
                    this->countUnicode++;
                    break;
                }
            }